

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O2

void anon_unknown.dwarf_4654::Test_TemplateTestUtilTest_IsHiddenSection::Run(void)

{
  TemplateString TVar1;
  bool bVar2;
  char *pcVar3;
  TemplateDictionaryPeer peer;
  TemplateString local_c0;
  TemplateString local_a0;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_c0,"test_IsHiddenSection");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_c0,(UnsafeArena *)0x0);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_c0,"SECTION");
  bVar2 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&peer,&local_c0);
  if (bVar2) {
    ctemplate::TemplateString::TemplateString(&local_a0,"SECTION");
    TVar1.length_ = local_a0.length_;
    TVar1.ptr_ = local_a0.ptr_;
    TVar1.is_immutable_ = local_a0.is_immutable_;
    TVar1._17_7_ = local_a0._17_7_;
    TVar1.id_ = local_a0.id_;
    ctemplate::TemplateDictionary::AddSectionDictionary(TVar1);
    peer.dict_ = &dict;
    ctemplate::TemplateString::TemplateString(&local_c0,"SECTION");
    bVar2 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&peer,&local_c0);
    if (!bVar2) {
      ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
      return;
    }
    pcVar3 = "!(peer.IsHiddenSection(\"SECTION\"))";
  }
  else {
    pcVar3 = "peer.IsHiddenSection(\"SECTION\")";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar3);
  exit(1);
}

Assistant:

TEST(TemplateTestUtilTest, IsHiddenSection) {
  TemplateDictionary dict("test_IsHiddenSection");

  {
    TemplateDictionaryPeer peer(&dict);
    EXPECT_TRUE(peer.IsHiddenSection("SECTION"));
  }

  dict.AddSectionDictionary("SECTION");

  {
    TemplateDictionaryPeer peer(&dict);
    EXPECT_FALSE(peer.IsHiddenSection("SECTION"));
  }
}